

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc_ball.cpp
# Opt level: O1

vec3 __thiscall lumeview::ArcBall::get_ball_point_from_frame_coords(ArcBall *this,vec2 *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  vec3 vVar5;
  
  fVar1 = (this->m_frame).field_0.field_0.x;
  fVar4 = (this->m_frame).field_0.field_0.y;
  fVar3 = (((c->field_0).field_0.x - (this->m_offset).field_0.field_0.x) - fVar1 * 0.5) /
          (fVar1 * this->m_radius * 0.5);
  fVar4 = (((c->field_0).field_0.y - (this->m_offset).field_0.field_0.y) - fVar4 * 0.5) /
          (this->m_radius * fVar4 * 0.5);
  fVar1 = fVar3 * fVar3 + fVar4 * fVar4;
  if (fVar1 <= 1.0) {
    fVar1 = 1.0 - fVar1;
    if (fVar1 < 0.0) {
      fVar2 = sqrtf(fVar1);
    }
    else {
      fVar2 = SQRT(fVar1);
    }
  }
  else {
    if (fVar1 < 0.0) {
      fVar1 = sqrtf(fVar1);
    }
    else {
      fVar1 = SQRT(fVar1);
    }
    fVar2 = 0.0;
    fVar3 = fVar3 * (1.0 / fVar1);
    fVar4 = fVar4 * (1.0 / fVar1);
  }
  vVar5.field_0.field_0.y = fVar4;
  vVar5.field_0.field_0.x = fVar3;
  vVar5.field_0.field_0.z = fVar2;
  return (vec3)vVar5.field_0;
}

Assistant:

glm::vec3 ArcBall::get_ball_point_from_frame_coords(const glm::vec2& c) const
{
    vec3 p;
    p.x   = (c.x - m_offset.x - m_frame.x / 2.f) / (m_radius * m_frame.x / 2.f);
    p.y   = (c.y - m_offset.y - m_frame.y / 2.f) / (m_radius * m_frame.y / 2.f);
    p.z   = 0.0f;

    const float mag = p.x * p.x + p.y * p.y;

    if (mag > 1.0f) {
        float scale = 1.0f / sqrtf (mag);
        p.x *= scale;
        p.y *= scale;
    }
    else
        p.z = sqrtf (1.0f - mag);

    return p;
}